

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

uchar yy_find_shift_action(uchar iLookAhead,uchar stateno)

{
  uint uVar1;
  uchar local_9;
  int i;
  uchar stateno_local;
  uchar iLookAhead_local;
  
  local_9 = stateno;
  if (stateno < 0x27) {
    if (0x26 < stateno) {
      __assert_fail("stateno <= YY_SHIFT_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x2af,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    uVar1 = (uint)"LLLLLLLLLLLLLLLLLLLLLL"[stateno];
    if (0x7b < uVar1) {
      __assert_fail("i<=YY_ACTTAB_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x2b6,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    if (0x93 < uVar1 + 0x18) {
      __assert_fail("i+YYNTOKEN<=(int)YY_NLOOKAHEAD",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x2b7,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    if (iLookAhead == '\x1a') {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x2b8,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    if (0x17 < iLookAhead) {
      __assert_fail("iLookAhead < YYNTOKEN",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x2b9,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    uVar1 = iLookAhead + uVar1;
    if (0x92 < uVar1) {
      __assert_fail("i<(int)YY_NLOOKAHEAD",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,699,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
    }
    if ("\x18\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x10\x11\x12\x16"[(int)uVar1]
        == iLookAhead) {
      if (0x7a < uVar1) {
        __assert_fail("i>=0 && i<(int)(sizeof(yy_action)/sizeof(yy_action[0]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                      ,0x2df,"unsigned char yy_find_shift_action(unsigned char, unsigned char)");
      }
      local_9 = "\x16\x05\x04\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x13\x12\x11CH\x05\x04\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\b\a\x06\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\n\t\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x0e\r\f\v\x10\x0f\x15\x14\x13\x12\x11\x10\x0f\x15\x14\x13\x12\x11\x15\x14\x13\x12\x11G\x02\x03\x01\\DG\x17F[\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$MLGK%&"
                [(int)uVar1];
    }
    else {
      local_9 = "EEEEEEEEEEEEEEEEEEEEEEEEZYXWVUTSRQPONJI"[stateno];
    }
  }
  return local_9;
}

Assistant:

static YYACTIONTYPE yy_find_shift_action(
  YYCODETYPE iLookAhead,    /* The look-ahead token */
  YYACTIONTYPE stateno      /* Current state number */
){
  int i;

  if( stateno>YY_MAX_SHIFT ) return stateno;
  assert( stateno <= YY_SHIFT_COUNT );
#if defined(YYCOVERAGE)
  yycoverage[stateno][iLookAhead] = 1;
#endif
  do{
    i = yy_shift_ofst[stateno];
    assert( i>=0 );
    assert( i<=YY_ACTTAB_COUNT );
    assert( i+YYNTOKEN<=(int)YY_NLOOKAHEAD );
    assert( iLookAhead!=YYNOCODE );
    assert( iLookAhead < YYNTOKEN );
    i += iLookAhead;
    assert( i<(int)YY_NLOOKAHEAD );
    if( yy_lookahead[i]!=iLookAhead ){
#ifdef YYFALLBACK
      YYCODETYPE iFallback;            /* Fallback token */
      assert( iLookAhead<sizeof(yyFallback)/sizeof(yyFallback[0]) );
      iFallback = yyFallback[iLookAhead];
      if( iFallback!=0 ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE, "%sFALLBACK %s => %s\n",
             yyTracePrompt, yyTokenName[iLookAhead], yyTokenName[iFallback]);
        }
#endif
        assert( yyFallback[iFallback]==0 ); /* Fallback loop must terminate */
        iLookAhead = iFallback;
        continue;
      }
#endif
#ifdef YYWILDCARD
      {
        int j = i - iLookAhead + YYWILDCARD;
        assert( j<(int)(sizeof(yy_lookahead)/sizeof(yy_lookahead[0])) );
        if( yy_lookahead[j]==YYWILDCARD && iLookAhead>0 ){
#ifndef NDEBUG
          if( yyTraceFILE ){
            fprintf(yyTraceFILE, "%sWILDCARD %s => %s\n",
               yyTracePrompt, yyTokenName[iLookAhead],
               yyTokenName[YYWILDCARD]);
          }
#endif /* NDEBUG */
          return yy_action[j];
        }
      }
#endif /* YYWILDCARD */
      return yy_default[stateno];
    }else{
      assert( i>=0 && i<(int)(sizeof(yy_action)/sizeof(yy_action[0])) );
      return yy_action[i];
    }
  }while(1);
}